

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_msg.c
# Opt level: O0

void * add_userid_option(pcp_flow_t *f,void *cur)

{
  uint16_t uVar1;
  pcp_userid_option_t *userid_op;
  void *cur_local;
  pcp_flow_t *f_local;
  
  *(undefined1 *)cur = 0x62;
  uVar1 = htons(0x200);
  *(uint16_t *)((long)cur + 2) = uVar1;
  memcpy((void *)((long)cur + 4),(f->f_userid).userid,0x200);
  return (void *)((long)cur + 0x204);
}

Assistant:

static void *add_userid_option(pcp_flow_t *f, void *cur) {
    pcp_userid_option_t *userid_op = (pcp_userid_option_t *)cur;

    userid_op->option = PCP_OPTION_USERID;
    userid_op->len =
        htons(sizeof(pcp_userid_option_t) - sizeof(pcp_options_hdr_t));
    memcpy(&(userid_op->userid[0]), &(f->f_userid.userid[0]), MAX_USER_ID);
    cur = userid_op + 1;

    return cur;
}